

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivVerify.cpp
# Opt level: O0

void DivVerifyInt64Uint64(void)

{
  bool bVar1;
  int64_t x;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  int64_t ret;
  TestCase<long,_unsigned_long,_1> test;
  TestVector<long,_unsigned_long,_1> tests;
  unsigned_long in_stack_fffffffffffffee8;
  allocator *in_stack_fffffffffffffef0;
  allocator *in_stack_fffffffffffffef8;
  TestVector<long,_unsigned_long,_1> *in_stack_ffffffffffffff00;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs
  ;
  long local_f0;
  byte local_e0;
  allocator local_d1;
  string local_d0 [32];
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_b0;
  long local_a8;
  allocator local_99;
  string local_98 [7];
  undefined1 in_stack_ffffffffffffff6f;
  unsigned_long in_stack_ffffffffffffff70;
  long in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_78;
  byte local_6d;
  allocator local_59;
  string local_58 [40];
  long local_30;
  unsigned_long local_28;
  byte local_20;
  TestVector<long,_unsigned_long,_1> local_18;
  
  TestVector<long,_unsigned_long,_1>::TestVector(&local_18);
  TestVector<long,_unsigned_long,_1>::GetNext(in_stack_ffffffffffffff00);
  while( true ) {
    bVar1 = TestVector<long,_unsigned_long,_1>::Done(&local_18);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = SafeDivide<long,unsigned_long>
                      ((long)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,(long *)0x19ca3e);
    if (bVar1 != (bool)(local_20 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_58,"Error in case int64_uint64: ",&local_59);
      err_msg<long,unsigned_long>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                 (bool)in_stack_ffffffffffffff6f);
      std::__cxx11::string::~string(local_58);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
    }
    local_6d = 1;
    rhs.m_int = (unsigned_long)&local_78;
    SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)rhs.m_int,&local_30);
    SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/=
              ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    if ((local_6d & 1) != (local_20 & 1)) {
      in_stack_fffffffffffffef8 = &local_99;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_98,"Error in case int64_uint64 throw: ",in_stack_fffffffffffffef8);
      err_msg<long,unsigned_long>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                 (bool)in_stack_ffffffffffffff6f);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
    }
    local_6d = 1;
    local_a8 = local_30;
    SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_b0,&local_28);
    operator/=((long *)in_stack_fffffffffffffef8,rhs);
    if ((local_6d & 1) != (local_20 & 1)) {
      in_stack_fffffffffffffef0 = &local_d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_d0,"Error in case int64_uint64 throw: ",in_stack_fffffffffffffef0);
      err_msg<long,unsigned_long>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                 (bool)in_stack_ffffffffffffff6f);
      std::__cxx11::string::~string(local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    }
    TestVector<long,_unsigned_long,_1>::GetNext((TestVector<long,_unsigned_long,_1> *)rhs.m_int);
    local_30 = local_f0;
    local_20 = local_e0;
  }
  return;
}

Assistant:

void DivVerifyInt64Uint64()
{
    TestVector< std::int64_t, std::uint64_t, OpType::Div > tests;
    TestCase< std::int64_t, std::uint64_t, OpType::Div > test = tests.GetNext();

    while (!tests.Done())
    {
      std::int64_t ret;
      if( SafeDivide(test.x, test.y, ret) != test.fExpected )
      {
         //assert(false);
          err_msg( "Error in case int64_uint64: ", test.x, test.y, test.fExpected );
      }

      // Now test throwing version
      bool fSuccess = true;
      try
      {
         SafeInt<std::int64_t> si(test.x);
         si /= test.y;
      }
      catch(...)
      {
         fSuccess = false;
      }

      if( fSuccess != test.fExpected )
      {
          err_msg( "Error in case int64_uint64 throw: ", test.x, test.y, test.fExpected );
      }

      // Also need to test the version that assigns back out
      // to a plain int, as it has different logic
      fSuccess = true;
      try
      {
         std::int64_t x(test.x);
         x /= SafeInt<std::uint64_t>(test.y);
      }
      catch(...)
      {
         fSuccess = false;
      }

      if( fSuccess != test.fExpected )
      {
         err_msg( "Error in case int64_uint64 throw: ", test.x, test.y, test.fExpected );
      }

      test = tests.GetNext();
   }
}